

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TimingControlStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingControlStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::TimingControlSyntax&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,TimingControlSyntax *args_2,
          StatementSyntax *args_3)

{
  TimingControlStatementSyntax *this_00;
  
  this_00 = (TimingControlStatementSyntax *)allocate(this,0x68,8);
  slang::syntax::TimingControlStatementSyntax::TimingControlStatementSyntax
            (this_00,*args,args_1,args_2,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }